

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReceptiveFieldEncodingSynapse.cpp
# Opt level: O2

double __thiscall
ReceptiveFieldEncodingSynapse::gaussian(ReceptiveFieldEncodingSynapse *this,int index,double value)

{
  ReceptiveFieldEncodingSynapse_param *pRVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  pRVar1 = this->param;
  auVar4._8_8_ = pRVar1->input_max - pRVar1->input_min;
  auVar4._0_8_ = 0x3ff0000000000000;
  auVar5._8_8_ = (double)(pRVar1->number_of_neurons + -1);
  auVar5._0_8_ = pRVar1->beta;
  auVar5 = divpd(auVar4,auVar5);
  dVar3 = auVar5._8_8_ * auVar5._0_8_;
  dVar2 = (value - ((double)index * auVar5._8_8_ + pRVar1->input_min)) / dVar3;
  dVar2 = exp(dVar2 * dVar2 * -0.5);
  return dVar2 * (1.0 / dVar3) * 2.5066282746310002;
}

Assistant:

double ReceptiveFieldEncodingSynapse::gaussian(int index, double value) {
    double center = param->input_min + ((2*index+1-1)/2)*((param->input_max-param->input_min)/(param->number_of_neurons-1));
    double variance = 1/param->beta*((param->input_max-param->input_min)/(param->number_of_neurons-1));
    double gauss = 1 / variance * sqrt(2*M_PI) * exp(-0.5 * pow((value - center) / variance, 2));
    return gauss;
}